

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O0

int mbedtls_mpi_cmp_abs(mbedtls_mpi *X,mbedtls_mpi *Y)

{
  size_t j;
  size_t i;
  mbedtls_mpi *Y_local;
  mbedtls_mpi *X_local;
  int local_4;
  
  for (i = (size_t)X->n; (i != 0 && (X->p[i - 1] == 0)); i = i - 1) {
  }
  for (j = (size_t)Y->n; (j != 0 && (Y->p[j - 1] == 0)); j = j - 1) {
  }
  if (j < i) {
    local_4 = 1;
  }
  else if (i < j) {
    local_4 = -1;
  }
  else {
    for (; i != 0; i = i - 1) {
      if (Y->p[i - 1] < X->p[i - 1]) {
        return 1;
      }
      if (X->p[i - 1] < Y->p[i - 1]) {
        return -1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mbedtls_mpi_cmp_abs(const mbedtls_mpi *X, const mbedtls_mpi *Y)
{
    size_t i, j;

    for (i = X->n; i > 0; i--) {
        if (X->p[i - 1] != 0) {
            break;
        }
    }

    for (j = Y->n; j > 0; j--) {
        if (Y->p[j - 1] != 0) {
            break;
        }
    }

    /* If i == j == 0, i.e. abs(X) == abs(Y),
     * we end up returning 0 at the end of the function. */

    if (i > j) {
        return 1;
    }
    if (j > i) {
        return -1;
    }

    for (; i > 0; i--) {
        if (X->p[i - 1] > Y->p[i - 1]) {
            return 1;
        }
        if (X->p[i - 1] < Y->p[i - 1]) {
            return -1;
        }
    }

    return 0;
}